

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

string * __thiscall
embree::ParseLocation::str_abi_cxx11_(string *__return_storage_ptr__,ParseLocation *this)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  long *plVar4;
  long *plVar5;
  ulong uVar6;
  uint uVar7;
  string __str;
  char *local_70 [2];
  char local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"unknown","");
  if ((this->fileName).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  uVar1 = this->lineNumber;
  if (-1 < (long)uVar1) {
    uVar7 = 1;
    if (9 < uVar1) {
      uVar6 = uVar1;
      uVar3 = 4;
      do {
        uVar7 = uVar3;
        if (uVar6 < 100) {
          uVar7 = uVar7 - 2;
          goto LAB_0018df61;
        }
        if (uVar6 < 1000) {
          uVar7 = uVar7 - 1;
          goto LAB_0018df61;
        }
        if (uVar6 < 10000) goto LAB_0018df61;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar3 = uVar7 + 4;
      } while (bVar2);
      uVar7 = uVar7 + 1;
    }
LAB_0018df61:
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar7);
    std::__detail::__to_chars_10_impl<unsigned_long_long>(local_70[0],uVar7,uVar1);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x252e45);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_40 = *plVar5;
      lStack_38 = plVar4[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar5;
      local_50 = (long *)*plVar4;
    }
    local_48 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if ((-1 < this->lineNumber) && (uVar1 = this->colNumber, -1 < (long)uVar1)) {
      uVar7 = 1;
      if (9 < uVar1) {
        uVar6 = uVar1;
        uVar3 = 4;
        do {
          uVar7 = uVar3;
          if (uVar6 < 100) {
            uVar7 = uVar7 - 2;
            goto LAB_0018e096;
          }
          if (uVar6 < 1000) {
            uVar7 = uVar7 - 1;
            goto LAB_0018e096;
          }
          if (uVar6 < 10000) goto LAB_0018e096;
          bVar2 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          uVar3 = uVar7 + 4;
        } while (bVar2);
        uVar7 = uVar7 + 1;
      }
LAB_0018e096:
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar7);
      std::__detail::__to_chars_10_impl<unsigned_long_long>(local_70[0],uVar7,uVar1);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x257261);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_40 = *plVar5;
        lStack_38 = plVar4[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar5;
        local_50 = (long *)*plVar4;
      }
      local_48 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
    {
      std::string str = "unknown";
      if (fileName) str = *fileName;
      if (lineNumber >= 0) str += " line " + toString(lineNumber);
      if (lineNumber >= 0 && colNumber >= 0) str += " character " + toString(colNumber);
      return str;
    }